

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idefs.h
# Opt level: O1

Am_Input_Char * __thiscall Am_Input_Char::operator=(Am_Input_Char *this,Am_Input_Char *value)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  
  *(undefined2 *)this = *(undefined2 *)value;
  uVar3 = *(ushort *)(value + 2) & 1;
  uVar1 = *(ushort *)(this + 2);
  *(ushort *)(this + 2) = uVar1 & 0xfffe | uVar3;
  uVar4 = *(ushort *)(value + 2) & 2;
  *(ushort *)(this + 2) = uVar1 & 0xfffc | uVar3 | uVar4;
  uVar5 = *(ushort *)(value + 2) & 4;
  *(ushort *)(this + 2) = uVar1 & 0xfff8 | uVar3 | uVar4 | uVar5;
  uVar6 = *(ushort *)(value + 2) & 8;
  *(ushort *)(this + 2) = uVar1 & 0xfff0 | uVar3 | uVar4 | uVar5 | uVar6;
  uVar2 = *(ushort *)(value + 2);
  *(ushort *)(this + 2) = uVar1 & 0xff00 | uVar3 | uVar4 | uVar5 | uVar6 | uVar2 & 0xf0;
  *(ushort *)(this + 2) =
       uVar1 & 0xf000 | uVar3 | uVar4 | uVar5 | uVar6 | uVar2 & 0xf0 |
       *(ushort *)(value + 2) & 0xf00;
  return this;
}

Assistant:

Am_Input_Char &operator=(const Am_Input_Char &value)
  {
    code = value.code;
    shift = value.shift;
    control = value.control;
    meta = value.meta;
    any_modifier = value.any_modifier;
    button_down = value.button_down;
    click_count = value.click_count;
    return *this;
  }